

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O0

void * WebRtc_CreateDelayEstimator(void *farend_handle,int max_lookahead)

{
  BinaryDelayEstimatorFarend *pBVar1;
  BinaryDelayEstimator *pBVar2;
  SpectrumType *pSVar3;
  int memory_fail;
  DelayEstimatorFarend *farend;
  DelayEstimator *self;
  int max_lookahead_local;
  void *farend_handle_local;
  
  farend = (DelayEstimatorFarend *)0x0;
  if (farend_handle != (void *)0x0) {
    farend = (DelayEstimatorFarend *)malloc(0x18);
  }
  if (farend != (DelayEstimatorFarend *)0x0) {
    pBVar2 = WebRtc_CreateBinaryDelayEstimator
                       (*(BinaryDelayEstimatorFarend **)((long)farend_handle + 0x10),max_lookahead);
    farend->binary_farend = (BinaryDelayEstimatorFarend *)pBVar2;
    pBVar1 = farend->binary_farend;
    pSVar3 = (SpectrumType *)malloc((long)*(int *)((long)farend_handle + 0xc) << 2);
    farend->mean_far_spectrum = pSVar3;
    farend->spectrum_size = *(int *)((long)farend_handle + 0xc);
    if (farend->mean_far_spectrum == (SpectrumType *)0x0 ||
        pBVar1 == (BinaryDelayEstimatorFarend *)0x0) {
      WebRtc_FreeDelayEstimator(farend);
      farend = (DelayEstimatorFarend *)0x0;
    }
  }
  return farend;
}

Assistant:

void* WebRtc_CreateDelayEstimator(void* farend_handle, int max_lookahead) {
  DelayEstimator* self = NULL;
  DelayEstimatorFarend* farend = (DelayEstimatorFarend*) farend_handle;

  if (farend_handle != NULL) {
    self = static_cast<DelayEstimator*>(malloc(sizeof(DelayEstimator)));
  }

  if (self != NULL) {
    int memory_fail = 0;

    // Allocate memory for the farend spectrum handling.
    self->binary_handle =
        WebRtc_CreateBinaryDelayEstimator(farend->binary_farend, max_lookahead);
    memory_fail |= (self->binary_handle == NULL);

    // Allocate memory for spectrum buffers.
    self->mean_near_spectrum = static_cast<SpectrumType*>(
        malloc(farend->spectrum_size * sizeof(SpectrumType)));
    memory_fail |= (self->mean_near_spectrum == NULL);

    self->spectrum_size = farend->spectrum_size;

    if (memory_fail) {
      WebRtc_FreeDelayEstimator(self);
      self = NULL;
    }
  }

  return self;
}